

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O3

void __thiscall
TPZSubMeshAnalysis::TPZSubMeshAnalysis(TPZSubMeshAnalysis *this,TPZSubCompMesh *mesh)

{
  double *pdVar1;
  TPZReference *pTVar2;
  ulong uVar3;
  double *pdVar4;
  
  TPZLinearAnalysis::TPZLinearAnalysis
            (&this->super_TPZLinearAnalysis,&PTR_PTR_0196aea0,&mesh->super_TPZCompMesh,true,
             (ostream *)&std::cout);
  (this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSubMeshAnalysis_0196ad90;
  (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018151d8;
  (this->fReferenceSolution).fElem = (double *)0x0;
  (this->fReferenceSolution).fGiven = (double *)0x0;
  (this->fReferenceSolution).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fReferenceSolution).fPivot.super_TPZVec<int>,0);
  (this->fReferenceSolution).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fReferenceSolution).fPivot.super_TPZVec<int>.fStore =
       (this->fReferenceSolution).fPivot.fExtAlloc;
  (this->fReferenceSolution).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fReferenceSolution).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fReferenceSolution).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this->fReferenceSolution).fWork.fStore = (double *)0x0;
  (this->fReferenceSolution).fWork.fNElements = 0;
  (this->fReferenceSolution).fWork.fNAlloc = 0;
  pTVar2 = (TPZReference *)operator_new(0x10);
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar2->fPointer = (TPZMatrix<double> *)0x0;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fReducableStiff).fRef = pTVar2;
  this->fMesh = mesh;
  if (mesh != (TPZSubCompMesh *)0x0) {
    uVar3 = TPZCompMesh::NEquations((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
    if (uVar3 != (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol *
                 (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) {
      pdVar1 = (this->fReferenceSolution).fElem;
      pdVar4 = (this->fReferenceSolution).fGiven;
      if (pdVar1 != pdVar4 && pdVar1 != (double *)0x0) {
        operator_delete__(pdVar1);
        pdVar4 = (this->fReferenceSolution).fGiven;
      }
      if ((pdVar4 == (double *)0x0) || ((this->fReferenceSolution).fSize < (long)uVar3)) {
        if (uVar3 == 0) {
          pdVar4 = (double *)0x0;
        }
        else {
          pdVar4 = (double *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
        }
      }
      (this->fReferenceSolution).fElem = pdVar4;
    }
    (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar3;
    (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    (*(this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(&this->fReferenceSolution);
  }
  return;
}

Assistant:

TPZSubMeshAnalysis::TPZSubMeshAnalysis(TPZSubCompMesh *mesh) : TPZRegisterClassId(&TPZSubMeshAnalysis::ClassId),
TPZLinearAnalysis(mesh,true), fReducableStiff(0){
	fMesh = mesh;
    if (fMesh)
    {
        fReferenceSolution.Redim(fCompMesh->NEquations(),1);
    }
}